

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressStream2_simpleArgs
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos,ZSTD_EndDirective endOp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined8 *in_RCX;
  ZSTD_inBuffer *in_RDX;
  ZSTD_outBuffer *in_RSI;
  ZSTD_CCtx *in_RDI;
  size_t cErr;
  ZSTD_inBuffer input;
  ZSTD_outBuffer output;
  
  uVar1 = *in_RCX;
  uVar2 = *input.src;
  sVar3 = ZSTD_compressStream2(in_RDI,in_RSI,in_RDX,(ZSTD_EndDirective)((ulong)in_RCX >> 0x20));
  *in_RCX = uVar1;
  *(undefined8 *)input.src = uVar2;
  return sVar3;
}

Assistant:

size_t ZSTD_compressStream2_simpleArgs (
                            ZSTD_CCtx* cctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos,
                            ZSTD_EndDirective endOp)
{
    ZSTD_outBuffer output;
    ZSTD_inBuffer  input;
    output.dst = dst;
    output.size = dstCapacity;
    output.pos = *dstPos;
    input.src = src;
    input.size = srcSize;
    input.pos = *srcPos;
    /* ZSTD_compressStream2() will check validity of dstPos and srcPos */
    {   size_t const cErr = ZSTD_compressStream2(cctx, &output, &input, endOp);
        *dstPos = output.pos;
        *srcPos = input.pos;
        return cErr;
    }
}